

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

void __thiscall tcu::DebugOutStreambuf::~DebugOutStreambuf(DebugOutStreambuf *this)

{
  long lVar1;
  
  *(undefined ***)this = &PTR__DebugOutStreambuf_00b6f4a0;
  lVar1 = std::ostream::tellp();
  if (lVar1 != 0) {
    flushLine(this);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_curLine);
  std::ios_base::~ios_base((ios_base *)&this->field_0xb0);
  *(code **)this = std::__cxx11::string::compare;
  std::locale::~locale((locale *)&this->field_0x38);
  return;
}

Assistant:

DebugOutStreambuf::~DebugOutStreambuf (void)
{
	if (m_curLine.tellp() != std::streampos(0))
		flushLine();
}